

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IndexAffinityOk(Expr *pExpr,char idx_affinity)

{
  char aff2;
  char cVar1;
  Expr *pExpr_00;
  bool bVar2;
  
  aff2 = sqlite3ExprAffinity(pExpr->pLeft);
  pExpr_00 = pExpr->pRight;
  if (pExpr_00 == (Expr *)0x0) {
    if ((pExpr->flags & 0x800) == 0) {
      cVar1 = 'A';
      if (aff2 != '\0') {
        cVar1 = aff2;
      }
      goto LAB_001add00;
    }
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
  }
  cVar1 = sqlite3CompareAffinity(pExpr_00,aff2);
LAB_001add00:
  if (cVar1 == 'A') {
    bVar2 = true;
  }
  else if (cVar1 == 'B') {
    bVar2 = idx_affinity == 'B';
  }
  else {
    bVar2 = 'B' < idx_affinity;
  }
  return (int)bVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexAffinityOk(Expr *pExpr, char idx_affinity){
  char aff = comparisonAffinity(pExpr);
  switch( aff ){
    case SQLITE_AFF_BLOB:
      return 1;
    case SQLITE_AFF_TEXT:
      return idx_affinity==SQLITE_AFF_TEXT;
    default:
      return sqlite3IsNumericAffinity(idx_affinity);
  }
}